

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQFunctionProto *fp;
  SQObjectPtr *self;
  SQUnsignedInteger nval_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar2 = stack_get(v,idx);
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLOSURE) {
    if ((ulong)((pSVar2->super_SQObject)._unVal.pClosure)->_function->_noutervalues <= nval) {
      SVar4 = sq_throwerror(v,"invalid free var index");
      return SVar4;
    }
    pSVar3 = stack_get(v,-1);
    SQObjectPtr::operator=
              (((((pSVar2->super_SQObject)._unVal.pClosure)->_outervalues[nval].super_SQObject.
                 _unVal.pArray)->_values)._vals,pSVar3);
  }
  else {
    if (SVar1 != OT_NATIVECLOSURE) {
      SVar5 = sq_aux_invalidtype(v,(pSVar2->super_SQObject)._type);
      return SVar5;
    }
    if (((pSVar2->super_SQObject)._unVal.pClosure)->_defaultparams <= nval) {
      SVar4 = sq_throwerror(v,"invalid free var index");
      return SVar4;
    }
    pSVar3 = stack_get(v,-1);
    SQObjectPtr::operator=(((pSVar2->super_SQObject)._unVal.pClosure)->_outervalues + nval,pSVar3);
  }
  SQVM::Pop(v);
  return 0;
}

Assistant:

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(type(self))
    {
    case OT_CLOSURE:{
        SQFunctionProto *fp = _closure(self)->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval){
            *(_outer(_closure(self)->_outervalues[nval])->_valptr) = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
                    }
        break;
    case OT_NATIVECLOSURE:
        if(_nativeclosure(self)->_noutervalues > nval){
            _nativeclosure(self)->_outervalues[nval] = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
        break;
    default:
        return sq_aux_invalidtype(v,type(self));
    }
    v->Pop();
    return SQ_OK;
}